

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

CaseTreeNode * tcu::parseCaseList(istream *in)

{
  size_t __n;
  byte bVar1;
  pointer ppCVar2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  CaseTreeNode *pCVar9;
  invalid_argument *piVar10;
  char *pcVar11;
  bool bVar12;
  vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> nodeStack;
  string curName;
  vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> local_88;
  string local_70;
  value_type local_50;
  CaseTreeNode *local_48;
  CaseTreeNode *local_40;
  long local_38;
  
  pCVar9 = (CaseTreeNode *)operator_new(0x38);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,0x98644f);
  (pCVar9->m_name)._M_dataplus._M_p = (pointer)&(pCVar9->m_name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pCVar9,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  (pCVar9->m_children).super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar9->m_children).super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar9->m_children).super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = pCVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  iVar4 = std::istream::peek();
  if (iVar4 == 0x7b) {
    local_50 = local_48;
    local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (CaseTreeNode **)0x0;
    local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (CaseTreeNode **)0x0;
    local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (CaseTreeNode **)0x0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    iVar4 = std::istream::get();
    if (iVar4 != 0x7b) {
      piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar10,"Malformed case trie");
      __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    if (local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>>::
      _M_realloc_insert<tcu::CaseTreeNode*const&>
                ((vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>> *)&local_88,
                 (iterator)
                 local_88.
                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_50);
    }
    else {
      *local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
       _M_impl.super__Vector_impl_data._M_finish = local_50;
      local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl
      .super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar12 = true;
      do {
        uVar8 = std::istream::get();
        sVar3 = local_70._M_string_length;
        if (uVar8 + 1 < 2) {
          piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar10,"Unterminated case tree");
LAB_008f3cfb:
          __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        if (((uVar8 == 0x2c) || (uVar8 == 0x7d)) || (uVar8 == 0x7b)) {
          if ((local_70._M_string_length == 0) || (!bVar12)) {
            if ((local_70._M_string_length == 0) == bVar12) {
              piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
              pcVar11 = "Missing node separator";
              if (bVar12 != false) {
                pcVar11 = "Empty node name";
              }
              std::invalid_argument::invalid_argument(piVar10,pcVar11);
              goto LAB_008f3cfb;
            }
          }
          else {
            pCVar9 = (CaseTreeNode *)operator_new(0x38);
            (pCVar9->m_name)._M_dataplus._M_p = (pointer)&(pCVar9->m_name).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)pCVar9,local_70._M_dataplus._M_p,local_70._M_dataplus._M_p + sVar3)
            ;
            (pCVar9->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pCVar9->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pCVar9->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_40 = pCVar9;
            CaseTreeNode::addChild
                      (local_88.
                       super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1],pCVar9);
            if (uVar8 == 0x7b) {
              if (local_88.
                  super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_88.
                  super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>>::
                _M_realloc_insert<tcu::CaseTreeNode*const&>
                          ((vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>> *)
                           &local_88,
                           (iterator)
                           local_88.
                           super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_40);
              }
              else {
                *local_88.
                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_40;
                local_88.
                super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_88.
                     super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            local_70._M_string_length = 0;
            *local_70._M_dataplus._M_p = '\0';
          }
          bVar12 = true;
          if (uVar8 == 0x7d) {
            local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_88.
                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
            if (local_88.
                super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                local_88.
                super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              iVar4 = std::istream::peek();
              if (iVar4 == 0xd) {
                std::istream::get();
              }
              iVar4 = std::istream::peek();
              if (iVar4 == 10) {
                std::istream::get();
              }
            }
            bVar12 = false;
          }
        }
        else {
          bVar1 = (byte)uVar8;
          if (((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
             ((bVar1 != 0x5f && ((uVar8 & 0xff) != 0x2d)))) {
            piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar10,"Illegal character in node name");
            goto LAB_008f3cfb;
          }
          std::__cxx11::string::push_back((char)&local_70);
        }
      } while (local_88.
               super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl
               .super__Vector_impl_data._M_start !=
               local_88.
               super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
  }
  else {
    local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (CaseTreeNode **)0x0;
    local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (CaseTreeNode **)0x0;
    iVar4 = 0;
    local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (CaseTreeNode **)0x0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_50 = (CaseTreeNode *)0x0;
    std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::resize
              (&local_88,8,&local_50);
    *local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
     super__Vector_impl_data._M_start = local_48;
    do {
      uVar8 = std::istream::get();
      sVar3 = local_70._M_string_length;
      uVar5 = uVar8 + 1;
      if (uVar5 < 0x30) {
        if ((0x4803UL >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
          if ((ulong)uVar5 != 0x2f) goto LAB_008f39a7;
          if (local_70._M_string_length == 0) {
            piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar10,"Empty test group name");
            goto LAB_008f3cbb;
          }
          iVar6 = iVar4 + 1;
          if ((int)((ulong)((long)local_88.
                                  super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88.
                                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) <= iVar6) {
            local_50 = (CaseTreeNode *)0x0;
            std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::resize
                      (&local_88,
                       (long)local_88.
                             super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88.
                             super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2,&local_50);
          }
          ppCVar2 = local_88.
                    super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pCVar9 = local_88.
                   super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar6];
          if (((pCVar9 == (CaseTreeNode *)0x0) ||
              (__n = (pCVar9->m_name)._M_string_length, __n != local_70._M_string_length)) ||
             ((__n != 0 &&
              (iVar7 = bcmp((pCVar9->m_name)._M_dataplus._M_p,local_70._M_dataplus._M_p,__n),
              iVar7 != 0)))) {
            pCVar9 = ppCVar2[iVar4];
            local_38 = (long)iVar6;
            iVar7 = CaseTreeNode::findChildNdx(pCVar9,&local_70);
            if (iVar7 == -1) {
              pCVar9 = (CaseTreeNode *)0x0;
            }
            else {
              pCVar9 = (pCVar9->m_children).
                       super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar7];
            }
            if (pCVar9 == (CaseTreeNode *)0x0) {
              pCVar9 = (CaseTreeNode *)operator_new(0x38);
              (pCVar9->m_name)._M_dataplus._M_p = (pointer)&(pCVar9->m_name).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)pCVar9,local_70._M_dataplus._M_p,
                         local_70._M_dataplus._M_p + local_70._M_string_length);
              (pCVar9->m_children).
              super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (pCVar9->m_children).
              super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (pCVar9->m_children).
              super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              CaseTreeNode::addChild
                        (local_88.
                         super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar4],pCVar9);
            }
            local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start[local_38] = pCVar9;
            if (iVar4 + 2 <
                (int)((ulong)((long)local_88.
                                    super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_88.
                                   super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
              local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar4 + 2] = (CaseTreeNode *)0x0;
            }
          }
          local_70._M_string_length = 0;
          *local_70._M_dataplus._M_p = '\0';
          bVar12 = true;
          iVar4 = iVar6;
        }
        else {
          if (local_70._M_string_length == 0) {
            piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar10,"Empty test case name");
            goto LAB_008f3cbb;
          }
          iVar6 = CaseTreeNode::findChildNdx
                            (local_88.
                             super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar4],&local_70);
          if (iVar6 != -1) {
            piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar10,"Duplicate test case");
            goto LAB_008f3cbb;
          }
          pCVar9 = (CaseTreeNode *)operator_new(0x38);
          (pCVar9->m_name)._M_dataplus._M_p = (pointer)&(pCVar9->m_name).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)pCVar9,local_70._M_dataplus._M_p,local_70._M_dataplus._M_p + sVar3);
          (pCVar9->m_children).
          super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pCVar9->m_children).
          super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pCVar9->m_children).
          super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          CaseTreeNode::addChild
                    (local_88.
                     super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar4],pCVar9);
          local_70._M_string_length = 0;
          *local_70._M_dataplus._M_p = '\0';
          if ((uVar8 == 0xd) && (iVar4 = std::istream::peek(), iVar4 == 10)) {
            std::istream::get();
          }
          iVar4 = std::istream::peek();
          bVar12 = iVar4 - 1U < 0xfffffffe;
          iVar4 = 0;
        }
      }
      else {
LAB_008f39a7:
        bVar1 = (byte)uVar8;
        if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
            (bVar1 != 0x5f)) && ((uVar8 & 0xff) != 0x2d)) {
          piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar10,"Illegal character in test case name");
LAB_008f3cbb:
          __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        bVar12 = true;
        std::__cxx11::string::push_back((char)&local_70);
      }
    } while (bVar12);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if (local_88.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl
      .super__Vector_impl_data._M_start != (CaseTreeNode **)0x0) {
    operator_delete(local_88.
                    super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar4 = std::istream::get();
  if (1 < iVar4 + 1U) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar10,"Trailing characters at end of case list");
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return local_48;
}

Assistant:

static CaseTreeNode* parseCaseList (std::istream& in)
{
	CaseTreeNode* const root = new CaseTreeNode("");
	try
	{
		if (in.peek() == '{')
			parseCaseTrie(root, in);
		else
			parseCaseList(root, in);

		{
			const int curChr = in.get();
			if (curChr != std::char_traits<char>::eof() && curChr != 0)
				throw std::invalid_argument("Trailing characters at end of case list");
		}

		return root;
	}
	catch (...)
	{
		delete root;
		throw;
	}
}